

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeString(Interpreter *this,UString *v)

{
  unsigned_long uVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  _Rb_tree_node_base *p_Var5;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  anon_union_8_3_4e909c26_for_v extraout_RDX_00;
  anon_union_8_3_4e909c26_for_v aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Value VVar9;
  HeapEntity *local_28;
  
  VVar9._0_8_ = (HeapEntity *)operator_new(0x30);
  (VVar9._0_8_)->type = STRING;
  (VVar9._0_8_)->_vptr_HeapEntity = (_func_int **)&PTR__HeapString_002995a0;
  VVar9._0_8_[1]._vptr_HeapEntity = (_func_int **)(VVar9._0_8_ + 2);
  pcVar2 = (v->_M_dataplus)._M_p;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)(VVar9._0_8_ + 1),pcVar2,pcVar2 + v->_M_string_length);
  local_28 = VVar9._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(&(this->heap).entities,&local_28);
  (VVar9._0_8_)->mark = (this->heap).lastMark;
  lVar3 = (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = lVar3 >> 3;
  (this->heap).numEntities = uVar4;
  aVar6 = extraout_RDX;
  if (((this->heap).gcTuneMinObjects < uVar4) &&
     (auVar7._8_4_ = (int)(lVar3 >> 0x23), auVar7._0_8_ = uVar4, auVar7._12_4_ = 0x45300000,
     uVar1 = (this->heap).lastNumEntities, auVar8._8_4_ = (int)(uVar1 >> 0x20), auVar8._0_8_ = uVar1
     , auVar8._12_4_ = 0x45300000,
     ((auVar8._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
     (this->heap).gcTuneGrowthTrigger <
     (auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0))) {
    Heap::markFrom(&this->heap,VVar9._0_8_);
    Stack::mark(&this->stack,&this->heap);
    if (((this->scratch).t & ARRAY) != NULL_TYPE) {
      Heap::markFrom(&this->heap,(this->scratch).v.h);
    }
    for (p_Var5 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (*(HeapEntity **)(*(long *)(p_Var5 + 3) + 0x40) != (HeapEntity *)0x0) {
        Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var5 + 3) + 0x40));
      }
    }
    for (p_Var5 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var5 + 2));
    }
    Heap::sweep(&this->heap);
    aVar6 = extraout_RDX_00;
  }
  VVar9.v.h = aVar6.h;
  return VVar9;
}

Assistant:

Value makeString(const UString &v)
    {
        Value r;
        r.t = Value::STRING;
        r.v.h = makeHeap<HeapString>(v);
        return r;
    }